

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_enc.c
# Opt level: O0

void VP8IteratorReset(VP8EncIterator *it)

{
  VP8EncIterator *in_RDI;
  VP8Encoder *enc;
  int in_stack_ffffffffffffffec;
  VP8Encoder *it_00;
  
  it_00 = in_RDI->enc_;
  VP8IteratorSetRow((VP8EncIterator *)it_00,in_stack_ffffffffffffffec);
  VP8IteratorSetCountDown(in_RDI,it_00->mb_w_ * it_00->mb_h_);
  InitTop((VP8EncIterator *)it_00);
  memset(in_RDI->bit_count_,0,0x60);
  in_RDI->do_trellis_ = 0;
  return;
}

Assistant:

void VP8IteratorReset(VP8EncIterator* const it) {
  VP8Encoder* const enc = it->enc_;
  VP8IteratorSetRow(it, 0);
  VP8IteratorSetCountDown(it, enc->mb_w_ * enc->mb_h_);  // default
  InitTop(it);
  memset(it->bit_count_, 0, sizeof(it->bit_count_));
  it->do_trellis_ = 0;
}